

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CETestSuite.cpp
# Opt level: O3

bool __thiscall
CETestSuite::test_vect_<double>
          (CETestSuite *this,vector<double,_std::allocator<double>_> *value,
          vector<double,_std::allocator<double>_> *expected,double *tol,string *function,int *line)

{
  undefined8 *puVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  long *plVar5;
  undefined8 *puVar6;
  long lVar7;
  long *plVar8;
  ulong *puVar9;
  ulong uVar10;
  ulong uVar11;
  undefined8 uVar12;
  long lVar13;
  bool bVar14;
  uint __len;
  double dVar15;
  bool isMatch;
  string __str;
  undefined1 local_149;
  ulong *local_148;
  long local_140;
  ulong local_138;
  long lStack_130;
  string *local_128;
  uint *local_120;
  undefined8 *local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  CETestSuite *local_78;
  vector<double,_std::allocator<double>_> *local_70;
  char *local_68 [2];
  char local_58 [16];
  double local_48;
  undefined8 uStack_40;
  
  local_149 = 1;
  lVar7 = *(long *)value;
  lVar13 = *(long *)(value + 8);
  local_70 = value;
  if (lVar13 - lVar7 == *(long *)(expected + 8) - *(long *)expected) {
    local_128 = function;
    local_120 = (uint *)line;
    if (lVar13 != lVar7) {
      bVar14 = true;
      uVar10 = 0;
      local_78 = this;
      do {
        dVar2 = *(double *)(*(long *)expected + uVar10 * 8);
        dVar15 = ABS(*(double *)(lVar7 + uVar10 * 8) - dVar2);
        if (ABS(*tol * dVar2) < dVar15) {
          __len = 1;
          if (9 < uVar10) {
            uVar3 = 4;
            uVar11 = uVar10;
            do {
              __len = uVar3;
              uVar4 = (uint)uVar11;
              if (uVar4 < 100) {
                __len = __len - 2;
                goto LAB_001056e2;
              }
              if (uVar4 < 1000) {
                __len = __len - 1;
                goto LAB_001056e2;
              }
              if (uVar4 < 10000) goto LAB_001056e2;
              uVar11 = (uVar11 & 0xffffffff) / 10000;
              uVar3 = __len + 4;
            } while (99999 < uVar4);
            __len = __len + 1;
          }
LAB_001056e2:
          uStack_40 = 0;
          local_68[0] = local_58;
          local_48 = dVar15;
          std::__cxx11::string::_M_construct((ulong)local_68,(char)__len);
          std::__detail::__to_chars_10_impl<unsigned_int>(local_68[0],__len,(uint)uVar10);
          plVar5 = (long *)std::__cxx11::string::replace((ulong)local_68,0,(char *)0x0,0x107130);
          plVar8 = plVar5 + 2;
          if ((long *)*plVar5 == plVar8) {
            local_88 = *plVar8;
            lStack_80 = plVar5[3];
            local_98 = &local_88;
          }
          else {
            local_88 = *plVar8;
            local_98 = (long *)*plVar5;
          }
          local_90 = plVar5[1];
          *plVar5 = (long)plVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
          local_b8 = &local_a8;
          plVar8 = plVar5 + 2;
          if ((long *)*plVar5 == plVar8) {
            local_a8 = *plVar8;
            lStack_a0 = plVar5[3];
          }
          else {
            local_a8 = *plVar8;
            local_b8 = (long *)*plVar5;
          }
          local_b0 = plVar5[1];
          *plVar5 = (long)plVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_b8);
          local_148 = &local_138;
          puVar9 = (ulong *)(plVar5 + 2);
          if ((ulong *)*plVar5 == puVar9) {
            local_138 = *puVar9;
            lStack_130 = plVar5[3];
          }
          else {
            local_138 = *puVar9;
            local_148 = (ulong *)*plVar5;
          }
          local_140 = plVar5[1];
          *plVar5 = (long)puVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_d8,vsnprintf,0x148,"%f",local_48);
          uVar11 = 0xf;
          if (local_148 != &local_138) {
            uVar11 = local_138;
          }
          if (uVar11 < local_d8._M_string_length + local_140) {
            uVar12 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              uVar12 = local_d8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar12 < local_d8._M_string_length + local_140) goto LAB_001058e1;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_148);
          }
          else {
LAB_001058e1:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_148,(ulong)local_d8._M_dataplus._M_p);
          }
          puVar1 = puVar6 + 2;
          if ((undefined8 *)*puVar6 == puVar1) {
            local_108 = *puVar1;
            uStack_100 = puVar6[3];
            local_118 = &local_108;
          }
          else {
            local_108 = *puVar1;
            local_118 = (undefined8 *)*puVar6;
          }
          local_110 = puVar6[1];
          *puVar6 = puVar1;
          puVar6[1] = 0;
          *(undefined1 *)puVar1 = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_118);
          plVar8 = plVar5 + 2;
          if ((long *)*plVar5 == plVar8) {
            local_e8 = *plVar8;
            lStack_e0 = plVar5[3];
            local_f8 = &local_e8;
          }
          else {
            local_e8 = *plVar8;
            local_f8 = (long *)*plVar5;
          }
          local_f0 = plVar5[1];
          *plVar5 = (long)plVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          printf("- Fnc: %s, ln %d\n",(local_128->_M_dataplus)._M_p,(ulong)*local_120);
          printf("  [ ] %s\n",local_f8);
          if (local_f8 != &local_e8) {
            operator_delete(local_f8);
          }
          if (local_118 != &local_108) {
            operator_delete(local_118);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p);
          }
          if (local_148 != &local_138) {
            operator_delete(local_148);
          }
          if (local_b8 != &local_a8) {
            operator_delete(local_b8);
          }
          if (local_98 != &local_88) {
            operator_delete(local_98);
          }
          if (local_68[0] != local_58) {
            operator_delete(local_68[0]);
          }
          local_149 = 0;
          lVar7 = *(long *)local_70;
          lVar13 = *(long *)(local_70 + 8);
          bVar14 = false;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < (ulong)(lVar13 - lVar7 >> 3));
      this = local_78;
      if (!bVar14) goto LAB_00105b61;
    }
    local_f8 = &local_e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"VECTOR values and lengths ARE equal.","");
    printf("- Fnc: %s, ln %d\n",(local_128->_M_dataplus)._M_p,(ulong)*local_120);
    printf("  [x] %s\n",local_f8);
    if (local_f8 == &local_e8) goto LAB_00105b61;
  }
  else {
    local_f8 = &local_e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"VECTOR lengths are NOT equal.","");
    printf("- Fnc: %s, ln %d\n",(function->_M_dataplus)._M_p,(ulong)(uint)*line);
    printf("  [ ] %s\n",local_f8);
    if (local_f8 == &local_e8) goto LAB_00105b61;
  }
  operator_delete(local_f8);
LAB_00105b61:
  (*this->_vptr_CETestSuite[0xf])(this,&local_149);
  return (bool)local_149;
}

Assistant:

bool CETestSuite::test_vect_(const std::vector<T>& value,
                             const std::vector<T>& expected,
                             const T&           tol,
                             const std::string& function,
                             const int&         line)
{
    bool isMatch = true;
    if (value.size() == expected.size()) {
        for (int i=0; i<value.size(); i++) {
            T rel_tol = std::fabs(expected[i] * tol);
            T diff    = std::fabs(value[i] - expected[i]);
            if (diff > rel_tol) {
                log_failure("VECTOR values at index "+std::to_string(i)+" " +
                            "are NOT equal (difference = " + 
                            std::to_string(diff) + ")", function, line);
                isMatch = false;
            }
        }

        // If there is a match, then we consider the vectors to be equal
        if (isMatch) {
            log_success("VECTOR values and lengths ARE equal.", function, line);
        }
    } else {
        log_failure("VECTOR lengths are NOT equal.", function, line);
    }

    update_pass(isMatch);
    return isMatch;
}